

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O2

void __thiscall TasGrid::GridFourier::loadGpuNodes<double>(GridFourier *this)

{
  uint new_stride;
  size_t __p;
  CudaFourierData<double> *pCVar1;
  ulong uVar2;
  ulong uVar3;
  undefined4 *puVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  Data2D<int> transpoints;
  vector<int,_std::allocator<int>_> num_nodes;
  
  pCVar1 = (this->gpu_cache)._M_t.
           super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
           .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl;
  if (pCVar1 == (CudaFourierData<double> *)0x0) {
    Utils::make_unique<TasGrid::CudaFourierData<double>>();
    __p = transpoints.stride;
    transpoints.stride = 0;
    ::std::
    __uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
    ::reset((__uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
             *)&this->gpu_cache,(pointer)__p);
    ::std::
    unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
    ::~unique_ptr((unique_ptr<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                   *)&transpoints);
    pCVar1 = (this->gpu_cache)._M_t.
             super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
             .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl;
  }
  if ((pCVar1->num_nodes).num_entries == 0) {
    ::std::vector<int,_std::allocator<int>_>::vector
              (&num_nodes,(long)(this->super_BaseCanonicalGrid).num_dimensions,
               (allocator_type *)&transpoints);
    ::std::
    transform<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,TasGrid::GridFourier::loadGpuNodes<double>()const::_lambda(int)_1_>
              ((this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (this->max_levels).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish,
               num_nodes.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start);
    GpuVector<int>::load
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl)->
                num_nodes,(this->super_BaseCanonicalGrid).acceleration,&num_nodes);
    lVar6 = 0x18;
    if ((this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->super_BaseCanonicalGrid).points.indexes.super__Vector_base<int,_std::allocator<int>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      lVar6 = 0x40;
    }
    new_stride = *(uint *)((long)&(this->super_BaseCanonicalGrid).acceleration + lVar6);
    Data2D<int>::Data2D<int,int>
              (&transpoints,new_stride,(this->super_BaseCanonicalGrid).num_dimensions);
    uVar2 = 0;
    uVar7 = (ulong)new_stride;
    if ((int)new_stride < 1) {
      uVar7 = uVar2;
    }
    for (uVar3 = 0; uVar3 != uVar7; uVar3 = uVar3 + 1) {
      puVar4 = (undefined4 *)
               ((long)transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start + uVar2);
      for (lVar5 = 0; lVar5 < (this->super_BaseCanonicalGrid).num_dimensions; lVar5 = lVar5 + 1) {
        *puVar4 = *(undefined4 *)
                   (*(long *)((long)&(this->super_BaseCanonicalGrid)._vptr_BaseCanonicalGrid + lVar6
                             ) * uVar2 +
                    *(long *)((long)&(this->super_BaseCanonicalGrid).num_dimensions + lVar6) +
                   lVar5 * 4);
        puVar4 = puVar4 + transpoints.stride;
      }
      uVar2 = uVar2 + 4;
    }
    GpuVector<int>::load<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
              (&((this->gpu_cache)._M_t.
                 super___uniq_ptr_impl<TasGrid::CudaFourierData<double>,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_TasGrid::CudaFourierData<double>_*,_std::default_delete<TasGrid::CudaFourierData<double>_>_>
                 .super__Head_base<0UL,_TasGrid::CudaFourierData<double>_*,_false>._M_head_impl)->
                points,(this->super_BaseCanonicalGrid).acceleration,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start,
               (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
               transpoints.vec.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&transpoints.vec.super__Vector_base<int,_std::allocator<int>_>);
    ::std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&num_nodes.super__Vector_base<int,_std::allocator<int>_>);
  }
  return;
}

Assistant:

void GridFourier::loadGpuNodes() const{
    auto& ccache = getGpuCache<T>();
    if (!ccache) ccache = Utils::make_unique<CudaFourierData<T>>();
    if (!ccache->num_nodes.empty()) return;

    std::vector<int> num_nodes(num_dimensions);
    std::transform(max_levels.begin(), max_levels.end(), num_nodes.begin(), [](int l)->int{ return OneDimensionalMeta::getNumPoints(l, rule_fourier); });
    ccache->num_nodes.load(acceleration, num_nodes);

    const MultiIndexSet &work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();
    Data2D<int> transpoints(work.getNumIndexes(), num_dimensions);
    for(int i=0; i<num_points; i++)
        for(int j=0; j<num_dimensions; j++)
            transpoints.getStrip(j)[i] = work.getIndex(i)[j];
    ccache->points.load(acceleration, transpoints.begin(), transpoints.end());
}